

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ElemStack::addGlobalPrefix(ElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  PrefMapElem *pPVar1;
  uint uVar2;
  StackElem *pSVar3;
  XMLSize_t XVar4;
  
  if (this->fGlobalNamespaces == (StackElem *)0x0) {
    pSVar3 = (StackElem *)XMemory::operator_new(0x70,this->fMemoryManager);
    this->fGlobalNamespaces = pSVar3;
    pSVar3->fChildCapacity = 0;
    pSVar3->fChildCount = 0;
    pSVar3->fThisElement = (XMLElementDecl *)0x0;
    pSVar3->fMapCapacity = 0;
    pSVar3->fMapCount = 0;
    pSVar3->fChildren = (QName **)0x0;
    pSVar3->fMap = (PrefMapElem *)0x0;
    pSVar3->fSchemaElemName = (XMLCh *)0x0;
    pSVar3->fSchemaElemNameMaxLen = 0;
    pSVar3->fReaderNum = 0xffffffff;
    pSVar3->fValidationFlag = false;
    pSVar3->fCommentOrPISeen = false;
    pSVar3->fReferenceEscaped = false;
    pSVar3->fCurrentURI = this->fUnknownNamespaceId;
    pSVar3->fCurrentScope = 0xfffffffe;
    pSVar3->fCurrentGrammar = (Grammar *)0x0;
  }
  uVar2 = XMLStringPool::addOrFind(&this->fPrefixPool,prefixToAdd);
  pSVar3 = this->fGlobalNamespaces;
  XVar4 = pSVar3->fMapCount;
  if (XVar4 == pSVar3->fMapCapacity) {
    expandMap(this,pSVar3);
    pSVar3 = this->fGlobalNamespaces;
    XVar4 = pSVar3->fMapCount;
  }
  pPVar1 = pSVar3->fMap;
  pPVar1[XVar4].fPrefId = uVar2;
  pPVar1[XVar4].fURIId = uriId;
  pSVar3->fMapCount = XVar4 + 1;
  return;
}

Assistant:

void ElemStack::addGlobalPrefix(const XMLCh* const    prefixToAdd
                              , const unsigned int    uriId)
{
    if (!fGlobalNamespaces)
    {
        fGlobalNamespaces = new (fMemoryManager) StackElem;
        fGlobalNamespaces->fChildCapacity = 0;
        fGlobalNamespaces->fChildren = 0;
        fGlobalNamespaces->fMapCapacity = 0;
        fGlobalNamespaces->fMap = 0;
        fGlobalNamespaces->fMapCount = 0;
        fGlobalNamespaces->fSchemaElemName = 0;
        fGlobalNamespaces->fSchemaElemNameMaxLen = 0;
        fGlobalNamespaces->fThisElement = 0;
        fGlobalNamespaces->fReaderNum = 0xFFFFFFFF;
        fGlobalNamespaces->fChildCount = 0;
        fGlobalNamespaces->fValidationFlag = false;
        fGlobalNamespaces->fCommentOrPISeen = false;
        fGlobalNamespaces->fReferenceEscaped = false;
        fGlobalNamespaces->fCurrentURI = fUnknownNamespaceId;
        fGlobalNamespaces->fCurrentScope = Grammar::TOP_LEVEL_SCOPE;
        fGlobalNamespaces->fCurrentGrammar = 0;
    }

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (fGlobalNamespaces->fMapCount == fGlobalNamespaces->fMapCapacity)
        expandMap(fGlobalNamespaces);

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = fEmptyNamespaceId;
    else
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = uriId;

    // Bump the map count now
    fGlobalNamespaces->fMapCount++;
}